

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,double,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::EpochOperator>>
               (timestamp_t *ldata,double *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  timestamp_t tVar4;
  byte bVar5;
  double dVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  double *pdVar9;
  bool bVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  long lVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  idx_t idx_in_entry_1;
  ulong uVar14;
  idx_t idx_in_entry;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_88;
  idx_t local_80;
  ValidityMask *local_78;
  double *local_70;
  timestamp_t *local_68;
  ulong local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  ulong local_50;
  timestamp_t *local_48;
  double *local_40;
  ulong local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_78 = mask;
  local_70 = result_data;
  local_68 = ldata;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar15 = 0;
      do {
        tVar4.value = local_68[uVar15].value;
        bVar10 = duckdb::Value::IsFinite<duckdb::timestamp_t>(tVar4);
        if (bVar10) {
          lVar12 = duckdb::Timestamp::GetEpochMicroSeconds(tVar4);
          dVar6 = (double)lVar12 / 1000000.0;
        }
        else {
          _Var13._M_head_impl =
               (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var13._M_head_impl == (unsigned_long *)0x0) {
            local_88 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_88);
            p_Var8 = p_Stack_90;
            peVar7 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar7;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var8;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).
                                  validity_data);
            _Var13._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var13._M_head_impl;
          }
          bVar5 = (byte)uVar15 & 0x3f;
          _Var13._M_head_impl[uVar15 >> 6] =
               _Var13._M_head_impl[uVar15 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          dVar6 = 0.0;
        }
        local_70[uVar15] = dVar6;
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_88 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_98,(unsigned_long **)mask,&local_88);
      p_Var8 = p_Stack_90;
      peVar7 = local_98;
      local_98 = (element_type *)0x0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar7;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var8;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
         p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data)
      ;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar11->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_60 = count + 0x3f >> 6;
      local_58 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      local_50 = 0;
      uVar15 = 0;
      local_80 = count;
      do {
        pdVar9 = local_70;
        puVar1 = (local_78->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar17 = uVar15 + 0x40;
          if (count <= uVar15 + 0x40) {
            uVar17 = count;
          }
LAB_005d5632:
          uVar16 = uVar15;
          if (uVar15 < uVar17) {
            do {
              tVar4.value = local_68[uVar15].value;
              bVar10 = duckdb::Value::IsFinite<duckdb::timestamp_t>(tVar4);
              if (bVar10) {
                lVar12 = duckdb::Timestamp::GetEpochMicroSeconds(tVar4);
                dVar6 = (double)lVar12 / 1000000.0;
              }
              else {
                _Var13._M_head_impl =
                     (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (_Var13._M_head_impl == (unsigned_long *)0x0) {
                  local_88 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_88);
                  p_Var8 = p_Stack_90;
                  peVar7 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                           internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar7;
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var8;
                  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                     p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(local_58);
                  _Var13._M_head_impl =
                       (pTVar11->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       _Var13._M_head_impl;
                }
                bVar5 = (byte)uVar15 & 0x3f;
                _Var13._M_head_impl[uVar15 >> 6] =
                     _Var13._M_head_impl[uVar15 >> 6] &
                     (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                dVar6 = 0.0;
              }
              pdVar9[uVar15] = dVar6;
              uVar15 = uVar15 + 1;
              uVar16 = uVar17;
            } while (uVar17 != uVar15);
          }
        }
        else {
          uVar3 = puVar1[local_50];
          uVar17 = uVar15 + 0x40;
          if (count <= uVar15 + 0x40) {
            uVar17 = count;
          }
          count = local_80;
          uVar16 = uVar17;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_005d5632;
            local_38 = uVar17 - uVar15;
            uVar16 = uVar15;
            if (uVar15 <= uVar17 && local_38 != 0) {
              local_40 = local_70 + uVar15;
              local_48 = local_68 + uVar15;
              uVar14 = 0;
              do {
                if ((uVar3 >> (uVar14 & 0x3f) & 1) != 0) {
                  tVar4.value = local_48[uVar14].value;
                  bVar10 = duckdb::Value::IsFinite<duckdb::timestamp_t>(tVar4);
                  if (bVar10) {
                    lVar12 = duckdb::Timestamp::GetEpochMicroSeconds(tVar4);
                    dVar6 = (double)lVar12 / 1000000.0;
                  }
                  else {
                    _Var13._M_head_impl =
                         (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                    if (_Var13._M_head_impl == (unsigned_long *)0x0) {
                      local_88 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)&local_98,&local_88);
                      p_Var8 = p_Stack_90;
                      peVar7 = local_98;
                      local_98 = (element_type *)0x0;
                      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      p_Var2 = (result_mask->super_TemplatedValidityMask<unsigned_long>).
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = peVar7;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = p_Var8;
                      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                         p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                      }
                      pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->(local_58);
                      _Var13._M_head_impl =
                           (pTVar11->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                           _Var13._M_head_impl;
                    }
                    bVar5 = (byte)(uVar15 + uVar14) & 0x3f;
                    _Var13._M_head_impl[uVar15 + uVar14 >> 6] =
                         _Var13._M_head_impl[uVar15 + uVar14 >> 6] &
                         (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                    dVar6 = 0.0;
                  }
                  local_40[uVar14] = dVar6;
                }
                uVar14 = uVar14 + 1;
                count = local_80;
                uVar16 = uVar17;
              } while (local_38 != uVar14);
            }
          }
        }
        local_50 = local_50 + 1;
        uVar15 = uVar16;
      } while (local_50 != local_60);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}